

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_5.cpp
# Opt level: O1

void __thiscall Date::add_year(Date *this,int n)

{
  uint uVar1;
  undefined8 extraout_RAX;
  string local_30;
  
  if (0 < n) {
    if (((this->m == feb) && (this->d == 0x1d)) &&
       ((uVar1 = this->y + n, (uVar1 & 3) != 0 ||
        (((uVar1 * -0x3d70a3d7 + 0x51eb850 >> 2 | uVar1 * 0x40000000) < 0x28f5c29 &&
         (uVar1 != ((int)uVar1 / 400) * 400)))))) {
      this->m = mar;
      this->d = 1;
    }
    this->y = this->y + n;
    return;
  }
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"add_year() - negative argument passed","");
  error(&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void Date::add_year(int n)
{
	if (n <= 0)
		error("add_year() - negative argument passed");
	if (m == Month::feb && d == 29 && !is_leap(y + n))
	{
		m = Month::mar;
		d = 1;
	}
	y += n;
}